

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O2

void av1_dist_wtd_convolve_y_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  uint8_t *puVar2;
  CONV_BUF_TYPE *pCVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  int use_dist_wtd_avg;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  long lVar22;
  ulong uVar23;
  __m128i alVar24;
  __m128i alVar25;
  __m128i alVar26;
  __m128i alVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  char cVar36;
  int iVar37;
  uint8_t *puVar38;
  long lVar39;
  CONV_BUF_TYPE *pCVar40;
  CONV_BUF_TYPE *pCVar41;
  uint8_t *puVar42;
  short extraout_XMM0_Wa;
  short extraout_XMM0_Wa_00;
  short extraout_XMM0_Wa_01;
  short extraout_XMM0_Wa_02;
  int extraout_XMM0_Da;
  undefined1 uVar64;
  undefined1 uVar66;
  undefined1 uVar68;
  undefined1 uVar70;
  short extraout_XMM0_Wc;
  undefined1 uVar74;
  ulong uVar43;
  int extraout_XMM0_Db;
  short extraout_XMM0_We;
  int extraout_XMM0_Dc;
  short extraout_XMM0_Wg;
  int extraout_XMM0_Dd;
  undefined1 auVar44 [16];
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wd;
  short extraout_XMM0_Wf;
  short extraout_XMM0_Wh;
  undefined1 auVar45 [16];
  int extraout_XMM0_Da_00;
  int extraout_XMM0_Db_00;
  int extraout_XMM0_Dc_00;
  int extraout_XMM0_Dd_00;
  undefined1 auVar46 [16];
  short extraout_XMM0_Wb_00;
  short extraout_XMM0_Wc_00;
  short extraout_XMM0_Wd_00;
  short extraout_XMM0_We_00;
  short extraout_XMM0_Wf_00;
  short extraout_XMM0_Wg_00;
  short extraout_XMM0_Wh_00;
  undefined1 auVar47 [16];
  int extraout_XMM0_Da_01;
  undefined1 auVar48 [16];
  undefined1 uVar72;
  undefined1 uVar76;
  undefined1 auVar53 [16];
  uint8_t uVar65;
  uint8_t uVar67;
  uint8_t uVar69;
  uint8_t uVar71;
  uint8_t uVar73;
  uint8_t uVar75;
  uint8_t uVar77;
  undefined8 extraout_XMM0_Qa;
  int extraout_XMM0_Db_01;
  int extraout_XMM0_Dc_01;
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd_01;
  undefined1 auVar60 [16];
  short extraout_XMM0_Wb_01;
  short extraout_XMM0_Wc_01;
  short extraout_XMM0_Wd_01;
  short extraout_XMM0_We_01;
  short extraout_XMM0_Wf_01;
  short extraout_XMM0_Wg_01;
  short extraout_XMM0_Wh_01;
  undefined1 auVar61 [16];
  int extraout_XMM0_Da_02;
  undefined8 extraout_XMM0_Qa_00;
  int extraout_XMM0_Db_02;
  int extraout_XMM0_Dc_02;
  undefined8 extraout_XMM0_Qb_00;
  int extraout_XMM0_Dd_02;
  undefined1 auVar62 [16];
  short extraout_XMM0_Wb_02;
  short extraout_XMM0_Wc_02;
  short extraout_XMM0_Wd_02;
  short extraout_XMM0_We_02;
  short extraout_XMM0_Wf_02;
  short extraout_XMM0_Wg_02;
  short extraout_XMM0_Wh_02;
  undefined1 auVar63 [16];
  undefined2 uVar78;
  int iVar79;
  undefined1 uVar105;
  undefined1 uVar106;
  ulong uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar90 [16];
  __m128i alVar97;
  uint8_t uVar107;
  short sVar108;
  uint8_t uVar109;
  uint8_t uVar110;
  short sVar111;
  uint8_t uVar112;
  uint8_t uVar113;
  uint8_t uVar114;
  uint8_t uVar115;
  uint8_t uVar116;
  undefined1 uVar127;
  undefined1 uVar128;
  undefined1 uVar129;
  ulong uVar117;
  undefined1 auVar118 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  short sVar130;
  short sVar139;
  undefined1 uVar140;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 uVar142;
  undefined1 uVar143;
  ulong uVar141;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  __m128i data_ref_0;
  __m128i res_unsigned;
  uint8_t *local_250;
  __m128i wt;
  __m128i s [8];
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  __m128i coeffs [4];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  
  pCVar40 = conv_params->dst;
  lVar28 = (long)conv_params->dst_stride;
  iVar29 = 7 - conv_params->round_0;
  wt[0]._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  iVar37 = conv_params->round_0 + conv_params->round_1;
  cVar36 = (char)iVar37;
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
  coeffs[0][0]._0_4_ = *(undefined4 *)piVar1;
  coeffs[1][0]._0_4_ = *(undefined4 *)(piVar1 + 2);
  coeffs[2][0]._0_4_ = *(undefined4 *)(piVar1 + 4);
  coeffs[3][0]._0_4_ = *(undefined4 *)(piVar1 + 6);
  auVar81 = ZEXT416((uint)((1 << (0x15U - cVar36 & 0x1f)) + (1 << (0x16U - cVar36 & 0x1f))));
  uVar30 = 0xe - iVar37;
  lVar35 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
  puVar38 = src + -lVar35;
  iVar37 = conv_params->do_average;
  auVar131 = ZEXT416((uint)conv_params->round_1);
  use_dist_wtd_avg = conv_params->use_dist_wtd_comp_avg;
  auVar81 = pshuflw(auVar81,auVar81,0);
  auVar82 = pshuflw(auVar81,ZEXT416((uint)(1 << ((byte)uVar30 & 0x1f)) >> 1),0);
  iVar79 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  sVar108 = auVar82._0_2_;
  sVar130 = auVar81._0_2_;
  sVar139 = auVar81._2_2_;
  sVar111 = auVar82._2_2_;
  wt[0]._4_4_ = (undefined4)wt[0];
  wt[1]._0_4_ = (undefined4)wt[0];
  wt[1]._4_4_ = (undefined4)wt[0];
  coeffs[0][0]._4_4_ = (undefined4)coeffs[0][0];
  coeffs[0][1]._0_4_ = (undefined4)coeffs[0][0];
  coeffs[0][1]._4_4_ = (undefined4)coeffs[0][0];
  coeffs[1][0]._4_4_ = (undefined4)coeffs[1][0];
  coeffs[1][1]._0_4_ = (undefined4)coeffs[1][0];
  coeffs[1][1]._4_4_ = (undefined4)coeffs[1][0];
  coeffs[2][0]._4_4_ = (undefined4)coeffs[2][0];
  coeffs[2][1]._0_4_ = (undefined4)coeffs[2][0];
  coeffs[2][1]._4_4_ = (undefined4)coeffs[2][0];
  coeffs[3][0]._4_4_ = (undefined4)coeffs[3][0];
  coeffs[3][1]._0_4_ = (undefined4)coeffs[3][0];
  coeffs[3][1]._4_4_ = (undefined4)coeffs[3][0];
  if (w == 4) {
    uVar7 = *(undefined4 *)puVar38;
    lVar35 = (long)src_stride;
    uVar8 = *(undefined4 *)(puVar38 + lVar35);
    uVar105 = (undefined1)((uint)uVar8 >> 0x18);
    uVar74 = (undefined1)((uint)uVar8 >> 0x10);
    uVar70 = (undefined1)((uint)uVar8 >> 8);
    uVar9 = *(undefined4 *)(puVar38 + lVar35 * 2);
    uVar129 = (undefined1)((uint)uVar9 >> 0x18);
    uVar128 = (undefined1)((uint)uVar9 >> 0x10);
    uVar127 = (undefined1)((uint)uVar9 >> 8);
    uVar10 = *(undefined4 *)(puVar38 + lVar35 * 3);
    uVar143 = (undefined1)((uint)uVar10 >> 0x18);
    uVar142 = (undefined1)((uint)uVar10 >> 0x10);
    uVar140 = (undefined1)((uint)uVar10 >> 8);
    uVar11 = *(undefined4 *)(puVar38 + lVar35 * 4);
    uVar68 = (undefined1)((uint)uVar11 >> 0x18);
    uVar66 = (undefined1)((uint)uVar11 >> 0x10);
    uVar64 = (undefined1)((uint)uVar11 >> 8);
    uVar12 = *(undefined4 *)(puVar38 + lVar35 * 5);
    uVar106 = (undefined1)((uint)uVar12 >> 0x18);
    uVar76 = (undefined1)((uint)uVar12 >> 0x10);
    uVar72 = (undefined1)((uint)uVar12 >> 8);
    uVar13 = *(undefined4 *)(puVar38 + lVar35 * 6);
    uVar4 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar143,uVar129),uVar142),
                                                      CONCAT14(uVar128,uVar9)) >> 0x20),uVar140),
                              uVar127),CONCAT11((char)uVar10,(char)uVar9));
    uVar5 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar143),uVar66),
                                                      CONCAT14(uVar142,uVar10)) >> 0x20),uVar64),
                              uVar140),CONCAT11((char)uVar11,(char)uVar10));
    uVar43 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar106,uVar68),uVar76),
                                                       CONCAT14(uVar66,uVar11)) >> 0x20),uVar72),
                               uVar64),CONCAT11((char)uVar12,(char)uVar11));
    uVar80 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar13 >> 0x18
                                                                               ),uVar106),
                                                                (char)((uint)uVar13 >> 0x10)),
                                                       CONCAT14(uVar76,uVar12)) >> 0x20),
                                        (char)((uint)uVar13 >> 8)),uVar72),
                      CONCAT11((char)uVar13,(char)uVar12));
    s[1][0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar129,uVar105),uVar128),
                                                        CONCAT14(uVar74,uVar8)) >> 0x20),uVar127),
                                uVar70),CONCAT11((char)uVar9,(char)uVar8));
    s[0][0] = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar105,(char)((uint)uVar7
                                                                                        >> 0x18)),
                                                                 uVar74),
                                                        CONCAT14((char)((uint)uVar7 >> 0x10),uVar7))
                                              >> 0x20),uVar70),(char)((uint)uVar7 >> 8)),
                       CONCAT11((char)uVar8,(char)uVar7));
    do {
      uVar141 = uVar5;
      uVar117 = uVar4;
      s[2][1] = 0;
      s[2][0] = uVar117;
      s[0][1] = 0;
      s[3][1] = 0;
      s[3][0] = uVar141;
      s[1][1] = 0;
      s[5][1] = 0;
      s[5][0] = uVar80;
      s[4][1] = 0;
      s[4][0] = uVar43;
      uVar7 = *(undefined4 *)(puVar38 + lVar35 * 7);
      uVar74 = (undefined1)((uint)uVar7 >> 0x18);
      uVar72 = (undefined1)((uint)uVar7 >> 0x10);
      uVar70 = (undefined1)((uint)uVar7 >> 8);
      uVar23 = CONCAT62(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(uVar74,(char)((uint)uVar13 >>
                                                                                  0x18)),uVar72),
                                                   (char)((uint)uVar13 >> 0x10)),uVar70),
                                 (char)((uint)uVar13 >> 8)),CONCAT11((char)uVar7,(char)uVar13));
      s[6][1] = 0;
      s[6][0] = uVar23;
      uVar13 = *(undefined4 *)(puVar38 + lVar35 * 8);
      uVar68 = (undefined1)((uint)uVar13 >> 0x18);
      uVar66 = (undefined1)((uint)uVar13 >> 0x10);
      uVar64 = (undefined1)((uint)uVar13 >> 8);
      s[7][0]._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar74),uVar66),CONCAT14(uVar72,uVar7)) >> 0x20);
      s[7][0]._3_1_ = uVar64;
      s[7][0]._2_1_ = uVar70;
      uVar78 = CONCAT11((char)uVar13,(char)uVar7);
      s[7][0]._0_2_ = uVar78;
      s[7][1] = 0;
      convolve_lo_y(s,coeffs);
      auVar44._0_4_ = (extraout_XMM0_Da << iVar29) + iVar79 >> auVar131;
      auVar44._4_4_ = extraout_XMM0_Db + iVar79 >> auVar131;
      auVar44._8_4_ = extraout_XMM0_Dc + iVar79 >> auVar131;
      auVar44._12_4_ = extraout_XMM0_Dd + iVar79 >> auVar131;
      auVar81 = packssdw(auVar44,auVar44);
      res_unsigned[0]._0_2_ = auVar81._0_2_ + sVar130;
      res_unsigned[0]._2_2_ = auVar81._2_2_ + sVar139;
      res_unsigned[0]._4_2_ = auVar81._4_2_ + sVar130;
      res_unsigned[0]._6_2_ = auVar81._6_2_ + sVar139;
      res_unsigned[1]._0_2_ = auVar81._8_2_ + sVar130;
      res_unsigned[1]._2_2_ = auVar81._10_2_ + sVar139;
      res_unsigned[1]._4_2_ = auVar81._12_2_ + sVar130;
      res_unsigned[1]._6_2_ = auVar81._14_2_ + sVar139;
      if (iVar37 == 0) {
        *pCVar40 = (CONV_BUF_TYPE)res_unsigned[0];
        pCVar40[1] = res_unsigned[0]._2_2_;
        pCVar40[2] = res_unsigned[0]._4_2_;
        pCVar40[3] = res_unsigned[0]._6_2_;
        pCVar40[4] = (CONV_BUF_TYPE)res_unsigned[1];
        pCVar40[5] = res_unsigned[1]._2_2_;
        pCVar40[6] = res_unsigned[1]._4_2_;
        pCVar40[7] = res_unsigned[1]._6_2_;
      }
      else {
        data_ref_0[0] = *(longlong *)pCVar40;
        data_ref_0[1] = *(longlong *)(pCVar40 + 4);
        comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
        auVar45._0_2_ = extraout_XMM0_Wa + (sVar108 - sVar130);
        auVar45._2_2_ = extraout_XMM0_Wb + (sVar111 - sVar139);
        auVar45._4_2_ = extraout_XMM0_Wc + (sVar108 - sVar130);
        auVar45._6_2_ = extraout_XMM0_Wd + (sVar111 - sVar139);
        auVar45._8_2_ = extraout_XMM0_We + (sVar108 - sVar130);
        auVar45._10_2_ = extraout_XMM0_Wf + (sVar111 - sVar139);
        auVar45._12_2_ = extraout_XMM0_Wg + (sVar108 - sVar130);
        auVar45._14_2_ = extraout_XMM0_Wh + (sVar111 - sVar139);
        auVar81 = psraw(auVar45,ZEXT416(uVar30));
        sVar14 = auVar81._0_2_;
        sVar15 = auVar81._2_2_;
        sVar16 = auVar81._4_2_;
        sVar17 = auVar81._6_2_;
        *(uint *)dst0 =
             CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar81[6] - (0xff < sVar17),
                      CONCAT12((0 < sVar16) * (sVar16 < 0x100) * auVar81[4] - (0xff < sVar16),
                               CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar81[2] -
                                        (0xff < sVar15),
                                        (0 < sVar14) * (sVar14 < 0x100) * auVar81[0] -
                                        (0xff < sVar14))));
      }
      convolve_lo_y(s + 1,coeffs);
      auVar46._0_4_ = (extraout_XMM0_Da_00 << iVar29) + iVar79 >> auVar131;
      auVar46._4_4_ = extraout_XMM0_Db_00 + iVar79 >> auVar131;
      auVar46._8_4_ = extraout_XMM0_Dc_00 + iVar79 >> auVar131;
      auVar46._12_4_ = extraout_XMM0_Dd_00 + iVar79 >> auVar131;
      auVar81 = packssdw(auVar46,auVar46);
      res_unsigned[0]._0_2_ = auVar81._0_2_ + sVar130;
      res_unsigned[0]._2_2_ = auVar81._2_2_ + sVar139;
      res_unsigned[0]._4_2_ = auVar81._4_2_ + sVar130;
      res_unsigned[0]._6_2_ = auVar81._6_2_ + sVar139;
      res_unsigned[1]._0_2_ = auVar81._8_2_ + sVar130;
      res_unsigned[1]._2_2_ = auVar81._10_2_ + sVar139;
      res_unsigned[1]._4_2_ = auVar81._12_2_ + sVar130;
      res_unsigned[1]._6_2_ = auVar81._14_2_ + sVar139;
      if (iVar37 == 0) {
        pCVar41 = pCVar40 + lVar28;
        *pCVar41 = (CONV_BUF_TYPE)res_unsigned[0];
        pCVar41[1] = res_unsigned[0]._2_2_;
        pCVar41[2] = res_unsigned[0]._4_2_;
        pCVar41[3] = res_unsigned[0]._6_2_;
        pCVar41[4] = (CONV_BUF_TYPE)res_unsigned[1];
        pCVar41[5] = res_unsigned[1]._2_2_;
        pCVar41[6] = res_unsigned[1]._4_2_;
        pCVar41[7] = res_unsigned[1]._6_2_;
      }
      else {
        data_ref_0[0] = *(longlong *)(pCVar40 + lVar28);
        data_ref_0[1] = *(longlong *)(pCVar40 + lVar28 + 4);
        comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
        auVar47._0_2_ = extraout_XMM0_Wa_00 + (sVar108 - sVar130);
        auVar47._2_2_ = extraout_XMM0_Wb_00 + (sVar111 - sVar139);
        auVar47._4_2_ = extraout_XMM0_Wc_00 + (sVar108 - sVar130);
        auVar47._6_2_ = extraout_XMM0_Wd_00 + (sVar111 - sVar139);
        auVar47._8_2_ = extraout_XMM0_We_00 + (sVar108 - sVar130);
        auVar47._10_2_ = extraout_XMM0_Wf_00 + (sVar111 - sVar139);
        auVar47._12_2_ = extraout_XMM0_Wg_00 + (sVar108 - sVar130);
        auVar47._14_2_ = extraout_XMM0_Wh_00 + (sVar111 - sVar139);
        auVar81 = psraw(auVar47,ZEXT416(uVar30));
        sVar14 = auVar81._0_2_;
        sVar15 = auVar81._2_2_;
        sVar16 = auVar81._4_2_;
        sVar17 = auVar81._6_2_;
        *(uint *)(dst0 + dst_stride0) =
             CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar81[6] - (0xff < sVar17),
                      CONCAT12((0 < sVar16) * (sVar16 < 0x100) * auVar81[4] - (0xff < sVar16),
                               CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar81[2] -
                                        (0xff < sVar15),
                                        (0 < sVar14) * (sVar14 < 0x100) * auVar81[0] -
                                        (0xff < sVar14))));
      }
      puVar38 = puVar38 + lVar35 * 2;
      dst0 = dst0 + dst_stride0 + dst_stride0;
      pCVar40 = pCVar40 + lVar28 * 2;
      h = h + -2;
      uVar4 = uVar43;
      uVar5 = uVar80;
      uVar43 = uVar23;
      uVar80 = CONCAT17(uVar68,CONCAT16(uVar74,CONCAT15(uVar66,CONCAT14(uVar72,CONCAT13(uVar64,
                                                  CONCAT12(uVar70,uVar78))))));
      s[1][0] = uVar141;
      s[0][0] = uVar117;
    } while (h != 0);
  }
  else {
    lVar33 = (long)src_stride;
    lVar22 = (long)dst_stride0 * 2;
    lVar34 = 0;
    do {
      puVar2 = puVar38 + lVar33 * 6 + lVar34;
      uVar4 = *(ulong *)(puVar38 + lVar34);
      uVar5 = *(ulong *)(puVar38 + lVar33 + lVar34);
      uVar76 = (undefined1)(uVar5 >> 0x38);
      auVar52._8_6_ = 0;
      auVar52._0_8_ = uVar4;
      auVar52[0xe] = (char)(uVar4 >> 0x38);
      auVar52[0xf] = uVar76;
      auVar51._14_2_ = auVar52._14_2_;
      auVar51._8_5_ = 0;
      auVar51._0_8_ = uVar4;
      uVar74 = (undefined1)(uVar5 >> 0x30);
      auVar51[0xd] = uVar74;
      auVar50._13_3_ = auVar51._13_3_;
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar4;
      auVar50[0xc] = (char)(uVar4 >> 0x30);
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._8_3_ = 0;
      auVar49._0_8_ = uVar4;
      uVar72 = (undefined1)(uVar5 >> 0x28);
      auVar49[0xb] = uVar72;
      auVar48._11_5_ = auVar49._11_5_;
      auVar48._8_2_ = 0;
      auVar48._0_8_ = uVar4;
      auVar48[10] = (char)(uVar4 >> 0x28);
      auVar82._10_6_ = auVar48._10_6_;
      auVar82[8] = 0;
      auVar82._0_8_ = uVar4;
      uVar70 = (undefined1)(uVar5 >> 0x20);
      auVar82[9] = uVar70;
      auVar81._9_7_ = auVar82._9_7_;
      auVar81[8] = (char)(uVar4 >> 0x20);
      auVar81._0_8_ = uVar4;
      s[0][1] = auVar81._8_8_;
      uVar68 = (undefined1)(uVar5 >> 0x18);
      s[0][0]._7_1_ = uVar68;
      s[0][0]._6_1_ = (char)(uVar4 >> 0x18);
      uVar66 = (undefined1)(uVar5 >> 0x10);
      s[0][0]._5_1_ = uVar66;
      s[0][0]._4_1_ = (char)(uVar4 >> 0x10);
      uVar64 = (undefined1)(uVar5 >> 8);
      s[0][0]._3_1_ = uVar64;
      s[0][0]._2_1_ = (char)(uVar4 >> 8);
      s[0][0]._0_1_ = (undefined1)uVar4;
      s[1][0]._0_1_ = (undefined1)uVar5;
      s[0][0]._1_1_ = (undefined1)s[1][0];
      uVar4 = *(ulong *)(puVar38 + lVar33 * 2 + lVar34);
      uVar105 = (undefined1)(uVar4 >> 0x38);
      auVar89._8_6_ = 0;
      auVar89._0_8_ = uVar5;
      auVar89[0xe] = uVar76;
      auVar89[0xf] = uVar105;
      auVar88._14_2_ = auVar89._14_2_;
      auVar88._8_5_ = 0;
      auVar88._0_8_ = uVar5;
      uVar76 = (undefined1)(uVar4 >> 0x30);
      auVar88[0xd] = uVar76;
      auVar87._13_3_ = auVar88._13_3_;
      auVar87._8_4_ = 0;
      auVar87._0_8_ = uVar5;
      auVar87[0xc] = uVar74;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._8_3_ = 0;
      auVar86._0_8_ = uVar5;
      uVar74 = (undefined1)(uVar4 >> 0x28);
      auVar86[0xb] = uVar74;
      auVar85._11_5_ = auVar86._11_5_;
      auVar85._8_2_ = 0;
      auVar85._0_8_ = uVar5;
      auVar85[10] = uVar72;
      auVar84._10_6_ = auVar85._10_6_;
      auVar84[8] = 0;
      auVar84._0_8_ = uVar5;
      uVar72 = (undefined1)(uVar4 >> 0x20);
      auVar84[9] = uVar72;
      auVar83._9_7_ = auVar84._9_7_;
      auVar83[8] = uVar70;
      auVar83._0_8_ = uVar5;
      s[1][1] = auVar83._8_8_;
      uVar70 = (undefined1)(uVar4 >> 0x18);
      s[1][0]._7_1_ = uVar70;
      s[1][0]._6_1_ = uVar68;
      uVar68 = (undefined1)(uVar4 >> 0x10);
      s[1][0]._5_1_ = uVar68;
      s[1][0]._4_1_ = uVar66;
      uVar66 = (undefined1)(uVar4 >> 8);
      s[1][0]._3_1_ = uVar66;
      s[1][0]._2_1_ = uVar64;
      s[2][0]._0_1_ = (undefined1)uVar4;
      s[1][0]._1_1_ = (undefined1)s[2][0];
      uVar5 = *(ulong *)(puVar38 + lVar33 * 3 + lVar34);
      uVar140 = (undefined1)(uVar5 >> 0x38);
      auVar124._8_6_ = 0;
      auVar124._0_8_ = uVar4;
      auVar124[0xe] = uVar105;
      auVar124[0xf] = uVar140;
      auVar123._14_2_ = auVar124._14_2_;
      auVar123._8_5_ = 0;
      auVar123._0_8_ = uVar4;
      uVar129 = (undefined1)(uVar5 >> 0x30);
      auVar123[0xd] = uVar129;
      auVar122._13_3_ = auVar123._13_3_;
      auVar122._8_4_ = 0;
      auVar122._0_8_ = uVar4;
      auVar122[0xc] = uVar76;
      auVar121._12_4_ = auVar122._12_4_;
      auVar121._8_3_ = 0;
      auVar121._0_8_ = uVar4;
      uVar128 = (undefined1)(uVar5 >> 0x28);
      auVar121[0xb] = uVar128;
      auVar120._11_5_ = auVar121._11_5_;
      auVar120._8_2_ = 0;
      auVar120._0_8_ = uVar4;
      auVar120[10] = uVar74;
      auVar119._10_6_ = auVar120._10_6_;
      auVar119[8] = 0;
      auVar119._0_8_ = uVar4;
      uVar127 = (undefined1)(uVar5 >> 0x20);
      auVar119[9] = uVar127;
      auVar118._9_7_ = auVar119._9_7_;
      auVar118[8] = uVar72;
      auVar118._0_8_ = uVar4;
      s[2][1] = auVar118._8_8_;
      uVar106 = (undefined1)(uVar5 >> 0x18);
      s[2][0]._7_1_ = uVar106;
      s[2][0]._6_1_ = uVar70;
      uVar64 = (undefined1)(uVar5 >> 0x10);
      s[2][0]._5_1_ = uVar64;
      s[2][0]._4_1_ = uVar68;
      uVar105 = (undefined1)(uVar5 >> 8);
      s[2][0]._3_1_ = uVar105;
      s[2][0]._2_1_ = uVar66;
      s[3][0]._0_1_ = (undefined1)uVar5;
      s[2][0]._1_1_ = (undefined1)s[3][0];
      uVar4 = *(ulong *)(puVar38 + lVar33 * 4 + lVar34);
      uVar76 = (undefined1)(uVar4 >> 0x38);
      auVar138._8_6_ = 0;
      auVar138._0_8_ = uVar5;
      auVar138[0xe] = uVar140;
      auVar138[0xf] = uVar76;
      uVar74 = (undefined1)(uVar4 >> 0x30);
      auVar137._14_2_ = auVar138._14_2_;
      auVar137._8_5_ = 0;
      auVar137._0_8_ = uVar5;
      auVar137[0xd] = uVar74;
      auVar136._13_3_ = auVar137._13_3_;
      auVar136._8_4_ = 0;
      auVar136._0_8_ = uVar5;
      auVar136[0xc] = uVar129;
      uVar72 = (undefined1)(uVar4 >> 0x28);
      auVar135._12_4_ = auVar136._12_4_;
      auVar135._8_3_ = 0;
      auVar135._0_8_ = uVar5;
      auVar135[0xb] = uVar72;
      auVar134._11_5_ = auVar135._11_5_;
      auVar134._8_2_ = 0;
      auVar134._0_8_ = uVar5;
      auVar134[10] = uVar128;
      uVar70 = (undefined1)(uVar4 >> 0x20);
      auVar133._10_6_ = auVar134._10_6_;
      auVar133[8] = 0;
      auVar133._0_8_ = uVar5;
      auVar133[9] = uVar70;
      auVar132._9_7_ = auVar133._9_7_;
      auVar132[8] = uVar127;
      auVar132._0_8_ = uVar5;
      uVar68 = (undefined1)(uVar4 >> 0x18);
      s[3][1] = auVar132._8_8_;
      s[3][0]._7_1_ = uVar68;
      s[3][0]._6_1_ = uVar106;
      uVar66 = (undefined1)(uVar4 >> 0x10);
      s[3][0]._5_1_ = uVar66;
      s[3][0]._4_1_ = uVar64;
      uVar64 = (undefined1)(uVar4 >> 8);
      s[3][0]._3_1_ = uVar64;
      s[3][0]._2_1_ = uVar105;
      s[4][0]._0_1_ = (uint8_t)uVar4;
      s[3][0]._1_1_ = (uint8_t)s[4][0];
      uVar5 = *(ulong *)(puVar38 + lVar33 * 5 + lVar34);
      uVar105 = (undefined1)(uVar5 >> 0x38);
      auVar59._8_6_ = 0;
      auVar59._0_8_ = uVar4;
      auVar59[0xe] = uVar76;
      auVar59[0xf] = uVar105;
      auVar58._14_2_ = auVar59._14_2_;
      auVar58._8_5_ = 0;
      auVar58._0_8_ = uVar4;
      uVar76 = (undefined1)(uVar5 >> 0x30);
      auVar58[0xd] = uVar76;
      auVar57._13_3_ = auVar58._13_3_;
      auVar57._8_4_ = 0;
      auVar57._0_8_ = uVar4;
      auVar57[0xc] = uVar74;
      auVar56._12_4_ = auVar57._12_4_;
      auVar56._8_3_ = 0;
      auVar56._0_8_ = uVar4;
      uVar74 = (undefined1)(uVar5 >> 0x28);
      auVar56[0xb] = uVar74;
      auVar55._11_5_ = auVar56._11_5_;
      auVar55._8_2_ = 0;
      auVar55._0_8_ = uVar4;
      auVar55[10] = uVar72;
      auVar54._10_6_ = auVar55._10_6_;
      auVar54[8] = 0;
      auVar54._0_8_ = uVar4;
      uVar72 = (undefined1)(uVar5 >> 0x20);
      auVar54[9] = uVar72;
      auVar53._9_7_ = auVar54._9_7_;
      auVar53[8] = uVar70;
      auVar53._0_8_ = uVar4;
      s[4][1] = auVar53._8_8_;
      uVar70 = (undefined1)(uVar5 >> 0x18);
      s[4][0]._7_1_ = uVar70;
      s[4][0]._6_1_ = uVar68;
      uVar68 = (undefined1)(uVar5 >> 0x10);
      s[4][0]._5_1_ = uVar68;
      s[4][0]._4_1_ = uVar66;
      uVar66 = (undefined1)(uVar5 >> 8);
      s[4][0]._3_1_ = uVar66;
      s[4][0]._2_1_ = uVar64;
      s[5][0]._0_1_ = (undefined1)uVar5;
      s[4][0]._1_1_ = (undefined1)s[5][0];
      auVar96._8_6_ = 0;
      auVar96._0_8_ = uVar5;
      auVar96[0xe] = uVar105;
      auVar96[0xf] = puVar2[7];
      auVar95._14_2_ = auVar96._14_2_;
      auVar95._8_5_ = 0;
      auVar95._0_8_ = uVar5;
      auVar95[0xd] = puVar2[6];
      auVar94._13_3_ = auVar95._13_3_;
      auVar94._8_4_ = 0;
      auVar94._0_8_ = uVar5;
      auVar94[0xc] = uVar76;
      auVar93._12_4_ = auVar94._12_4_;
      auVar93._8_3_ = 0;
      auVar93._0_8_ = uVar5;
      auVar93[0xb] = puVar2[5];
      auVar92._11_5_ = auVar93._11_5_;
      auVar92._8_2_ = 0;
      auVar92._0_8_ = uVar5;
      auVar92[10] = uVar74;
      auVar91._10_6_ = auVar92._10_6_;
      auVar91[8] = 0;
      auVar91._0_8_ = uVar5;
      auVar91[9] = puVar2[4];
      auVar90._9_7_ = auVar91._9_7_;
      auVar90[8] = uVar72;
      auVar90._0_8_ = uVar5;
      s[5][1] = auVar90._8_8_;
      s[5][0]._7_1_ = puVar2[3];
      s[5][0]._6_1_ = uVar70;
      s[5][0]._5_1_ = puVar2[2];
      s[5][0]._4_1_ = uVar68;
      s[5][0]._3_1_ = puVar2[1];
      s[5][0]._2_1_ = uVar66;
      s[5][0]._1_1_ = *puVar2;
      lVar39 = 0;
      puVar31 = dst0 + dst_stride0;
      puVar32 = src + (src_stride * 8 - lVar35);
      pCVar41 = pCVar40;
      puVar42 = src + (src_stride * 7 - lVar35);
      uVar107 = *puVar2;
      uVar109 = puVar2[1];
      uVar110 = puVar2[2];
      uVar112 = puVar2[3];
      uVar113 = puVar2[4];
      uVar114 = puVar2[5];
      uVar115 = puVar2[6];
      uVar116 = puVar2[7];
      local_250 = dst0;
      do {
        alVar27 = s[5];
        alVar26 = s[4];
        alVar25 = s[3];
        alVar24 = s[2];
        uVar4 = *(ulong *)(puVar42 + lVar34);
        uVar76 = (undefined1)(uVar4 >> 0x38);
        uVar74 = (undefined1)(uVar4 >> 0x30);
        uVar72 = (undefined1)(uVar4 >> 0x28);
        uVar70 = (undefined1)(uVar4 >> 0x20);
        uVar68 = (undefined1)(uVar4 >> 0x18);
        uVar66 = (undefined1)(uVar4 >> 0x10);
        uVar64 = (undefined1)(uVar4 >> 8);
        alVar97[0]._0_1_ = (undefined1)uVar4;
        s[6][0]._1_1_ = (undefined1)alVar97[0];
        s[6][0]._0_1_ = uVar107;
        s[6][0]._2_1_ = uVar109;
        s[6][0]._3_1_ = uVar64;
        s[6][0]._4_1_ = uVar110;
        s[6][0]._5_1_ = uVar66;
        s[6][0]._6_1_ = uVar112;
        s[6][0]._7_1_ = uVar68;
        s[6][1]._0_1_ = uVar113;
        s[6][1]._1_1_ = uVar70;
        s[6][1]._2_1_ = uVar114;
        s[6][1]._3_1_ = uVar72;
        s[6][1]._4_1_ = uVar115;
        s[6][1]._5_1_ = uVar74;
        s[6][1]._6_1_ = uVar116;
        s[6][1]._7_1_ = uVar76;
        uVar6 = *(undefined8 *)(puVar32 + lVar34);
        uVar77 = (uint8_t)((ulong)uVar6 >> 0x38);
        auVar104._8_6_ = 0;
        auVar104._0_8_ = uVar4;
        auVar104[0xe] = uVar76;
        auVar104[0xf] = uVar77;
        uVar75 = (uint8_t)((ulong)uVar6 >> 0x30);
        auVar103._14_2_ = auVar104._14_2_;
        auVar103._8_5_ = 0;
        auVar103._0_8_ = uVar4;
        auVar103[0xd] = uVar75;
        auVar102._13_3_ = auVar103._13_3_;
        auVar102._8_4_ = 0;
        auVar102._0_8_ = uVar4;
        auVar102[0xc] = uVar74;
        uVar73 = (uint8_t)((ulong)uVar6 >> 0x28);
        auVar101._12_4_ = auVar102._12_4_;
        auVar101._8_3_ = 0;
        auVar101._0_8_ = uVar4;
        auVar101[0xb] = uVar73;
        auVar100._11_5_ = auVar101._11_5_;
        auVar100._8_2_ = 0;
        auVar100._0_8_ = uVar4;
        auVar100[10] = uVar72;
        uVar71 = (uint8_t)((ulong)uVar6 >> 0x20);
        auVar99._10_6_ = auVar100._10_6_;
        auVar99[8] = 0;
        auVar99._0_8_ = uVar4;
        auVar99[9] = uVar71;
        auVar98._9_7_ = auVar99._9_7_;
        auVar98[8] = uVar70;
        auVar98._0_8_ = uVar4;
        uVar69 = (uint8_t)((ulong)uVar6 >> 0x18);
        alVar97[1] = auVar98._8_8_;
        alVar97[0]._7_1_ = uVar69;
        alVar97[0]._6_1_ = uVar68;
        uVar67 = (uint8_t)((ulong)uVar6 >> 0x10);
        alVar97[0]._5_1_ = uVar67;
        alVar97[0]._4_1_ = uVar66;
        uVar65 = (uint8_t)((ulong)uVar6 >> 8);
        alVar97[0]._3_1_ = uVar65;
        alVar97[0]._2_1_ = uVar64;
        alVar97[0]._1_1_ = (uint8_t)uVar6;
        s[7] = alVar97;
        convolve_lo_y(s,coeffs);
        convolve_hi_y(s,coeffs);
        local_2c8 = (int)extraout_XMM0_Qa;
        iStack_2c4 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_2c0 = (int)extraout_XMM0_Qb;
        iStack_2bc = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar125._0_4_ = (local_2c8 << iVar29) + iVar79 >> auVar131;
        auVar125._4_4_ = iStack_2c4 + iVar79 >> auVar131;
        auVar125._8_4_ = iStack_2c0 + iVar79 >> auVar131;
        auVar125._12_4_ = iStack_2bc + iVar79 >> auVar131;
        auVar60._0_4_ = (extraout_XMM0_Da_01 << iVar29) + iVar79 >> auVar131;
        auVar60._4_4_ = extraout_XMM0_Db_01 + iVar79 >> auVar131;
        auVar60._8_4_ = extraout_XMM0_Dc_01 + iVar79 >> auVar131;
        auVar60._12_4_ = extraout_XMM0_Dd_01 + iVar79 >> auVar131;
        auVar81 = packssdw(auVar125,auVar60);
        res_unsigned[0]._0_2_ = auVar81._0_2_ + sVar130;
        res_unsigned[0]._2_2_ = auVar81._2_2_ + sVar139;
        res_unsigned[0]._4_2_ = auVar81._4_2_ + sVar130;
        res_unsigned[0]._6_2_ = auVar81._6_2_ + sVar139;
        res_unsigned[1]._0_2_ = auVar81._8_2_ + sVar130;
        res_unsigned[1]._2_2_ = auVar81._10_2_ + sVar139;
        res_unsigned[1]._4_2_ = auVar81._12_2_ + sVar130;
        res_unsigned[1]._6_2_ = auVar81._14_2_ + sVar139;
        if (iVar37 == 0) {
          *pCVar41 = (CONV_BUF_TYPE)res_unsigned[0];
          pCVar41[1] = res_unsigned[0]._2_2_;
          pCVar41[2] = res_unsigned[0]._4_2_;
          pCVar41[3] = res_unsigned[0]._6_2_;
          pCVar41[4] = (CONV_BUF_TYPE)res_unsigned[1];
          pCVar41[5] = res_unsigned[1]._2_2_;
          pCVar41[6] = res_unsigned[1]._4_2_;
          pCVar41[7] = res_unsigned[1]._6_2_;
        }
        else {
          data_ref_0[0] = *(longlong *)pCVar41;
          data_ref_0[1] = *(longlong *)(pCVar41 + 4);
          comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
          auVar61._0_2_ = extraout_XMM0_Wa_01 + (sVar108 - sVar130);
          auVar61._2_2_ = extraout_XMM0_Wb_01 + (sVar111 - sVar139);
          auVar61._4_2_ = extraout_XMM0_Wc_01 + (sVar108 - sVar130);
          auVar61._6_2_ = extraout_XMM0_Wd_01 + (sVar111 - sVar139);
          auVar61._8_2_ = extraout_XMM0_We_01 + (sVar108 - sVar130);
          auVar61._10_2_ = extraout_XMM0_Wf_01 + (sVar111 - sVar139);
          auVar61._12_2_ = extraout_XMM0_Wg_01 + (sVar108 - sVar130);
          auVar61._14_2_ = extraout_XMM0_Wh_01 + (sVar111 - sVar139);
          auVar81 = psraw(auVar61,ZEXT416(uVar30));
          sVar14 = auVar81._0_2_;
          sVar15 = auVar81._2_2_;
          sVar16 = auVar81._4_2_;
          sVar17 = auVar81._6_2_;
          sVar18 = auVar81._8_2_;
          sVar19 = auVar81._10_2_;
          sVar20 = auVar81._12_2_;
          sVar21 = auVar81._14_2_;
          *(ulong *)(local_250 + lVar34) =
               CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar81[0xe] - (0xff < sVar21),
                        CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar81[0xc] - (0xff < sVar20),
                                 CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar81[10] -
                                          (0xff < sVar19),
                                          CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar81[8] -
                                                   (0xff < sVar18),
                                                   CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                            auVar81[6] - (0xff < sVar17),
                                                            CONCAT12((0 < sVar16) * (sVar16 < 0x100)
                                                                     * auVar81[4] - (0xff < sVar16),
                                                                     CONCAT11((0 < sVar15) *
                                                                              (sVar15 < 0x100) *
                                                                              auVar81[2] -
                                                                              (0xff < sVar15),
                                                                              (0 < sVar14) *
                                                                              (sVar14 < 0x100) *
                                                                              auVar81[0] -
                                                                              (0xff < sVar14))))))))
          ;
        }
        convolve_lo_y(s + 1,coeffs);
        convolve_hi_y(s + 1,coeffs);
        local_88 = (int)extraout_XMM0_Qa_00;
        iStack_84 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        iStack_80 = (int)extraout_XMM0_Qb_00;
        iStack_7c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        auVar126._0_4_ = (local_88 << iVar29) + iVar79 >> auVar131;
        auVar126._4_4_ = iStack_84 + iVar79 >> auVar131;
        auVar126._8_4_ = iStack_80 + iVar79 >> auVar131;
        auVar126._12_4_ = iStack_7c + iVar79 >> auVar131;
        auVar62._0_4_ = (extraout_XMM0_Da_02 << iVar29) + iVar79 >> auVar131;
        auVar62._4_4_ = extraout_XMM0_Db_02 + iVar79 >> auVar131;
        auVar62._8_4_ = extraout_XMM0_Dc_02 + iVar79 >> auVar131;
        auVar62._12_4_ = extraout_XMM0_Dd_02 + iVar79 >> auVar131;
        auVar81 = packssdw(auVar126,auVar62);
        res_unsigned[0]._0_2_ = auVar81._0_2_ + sVar130;
        res_unsigned[0]._2_2_ = auVar81._2_2_ + sVar139;
        res_unsigned[0]._4_2_ = auVar81._4_2_ + sVar130;
        res_unsigned[0]._6_2_ = auVar81._6_2_ + sVar139;
        res_unsigned[1]._0_2_ = auVar81._8_2_ + sVar130;
        res_unsigned[1]._2_2_ = auVar81._10_2_ + sVar139;
        res_unsigned[1]._4_2_ = auVar81._12_2_ + sVar130;
        res_unsigned[1]._6_2_ = auVar81._14_2_ + sVar139;
        if (iVar37 == 0) {
          pCVar3 = pCVar41 + lVar28;
          *pCVar3 = (CONV_BUF_TYPE)res_unsigned[0];
          pCVar3[1] = res_unsigned[0]._2_2_;
          pCVar3[2] = res_unsigned[0]._4_2_;
          pCVar3[3] = res_unsigned[0]._6_2_;
          pCVar3[4] = (CONV_BUF_TYPE)res_unsigned[1];
          pCVar3[5] = res_unsigned[1]._2_2_;
          pCVar3[6] = res_unsigned[1]._4_2_;
          pCVar3[7] = res_unsigned[1]._6_2_;
        }
        else {
          data_ref_0[0] = *(longlong *)(pCVar41 + lVar28);
          data_ref_0[1] = *(longlong *)(pCVar41 + lVar28 + 4);
          comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
          auVar63._0_2_ = extraout_XMM0_Wa_02 + (sVar108 - sVar130);
          auVar63._2_2_ = extraout_XMM0_Wb_02 + (sVar111 - sVar139);
          auVar63._4_2_ = extraout_XMM0_Wc_02 + (sVar108 - sVar130);
          auVar63._6_2_ = extraout_XMM0_Wd_02 + (sVar111 - sVar139);
          auVar63._8_2_ = extraout_XMM0_We_02 + (sVar108 - sVar130);
          auVar63._10_2_ = extraout_XMM0_Wf_02 + (sVar111 - sVar139);
          auVar63._12_2_ = extraout_XMM0_Wg_02 + (sVar108 - sVar130);
          auVar63._14_2_ = extraout_XMM0_Wh_02 + (sVar111 - sVar139);
          auVar81 = psraw(auVar63,ZEXT416(uVar30));
          sVar14 = auVar81._0_2_;
          sVar15 = auVar81._2_2_;
          sVar16 = auVar81._4_2_;
          sVar17 = auVar81._6_2_;
          sVar18 = auVar81._8_2_;
          sVar19 = auVar81._10_2_;
          sVar20 = auVar81._12_2_;
          sVar21 = auVar81._14_2_;
          *(ulong *)(puVar31 + lVar34) =
               CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar81[0xe] - (0xff < sVar21),
                        CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar81[0xc] - (0xff < sVar20),
                                 CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar81[10] -
                                          (0xff < sVar19),
                                          CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar81[8] -
                                                   (0xff < sVar18),
                                                   CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                            auVar81[6] - (0xff < sVar17),
                                                            CONCAT12((0 < sVar16) * (sVar16 < 0x100)
                                                                     * auVar81[4] - (0xff < sVar16),
                                                                     CONCAT11((0 < sVar15) *
                                                                              (sVar15 < 0x100) *
                                                                              auVar81[2] -
                                                                              (0xff < sVar15),
                                                                              (0 < sVar14) *
                                                                              (sVar14 < 0x100) *
                                                                              auVar81[0] -
                                                                              (0xff < sVar14))))))))
          ;
        }
        lVar39 = lVar39 + 2;
        s[4][0]._1_1_ = (undefined1)alVar97[0];
        s[4][0]._0_1_ = uVar107;
        s[4][0]._2_1_ = uVar109;
        s[4][0]._3_1_ = uVar64;
        s[4][0]._4_1_ = uVar110;
        s[4][0]._5_1_ = uVar66;
        s[4][0]._6_1_ = uVar112;
        s[4][0]._7_1_ = uVar68;
        s[4][1]._0_1_ = uVar113;
        s[4][1]._1_1_ = uVar70;
        s[4][1]._2_1_ = uVar114;
        s[4][1]._3_1_ = uVar72;
        s[4][1]._4_1_ = uVar115;
        s[4][1]._5_1_ = uVar74;
        s[4][1]._6_1_ = uVar116;
        s[4][1]._7_1_ = uVar76;
        pCVar41 = pCVar41 + lVar28 * 2;
        puVar31 = puVar31 + lVar22;
        local_250 = local_250 + lVar22;
        puVar32 = puVar32 + lVar33 * 2;
        puVar42 = puVar42 + lVar33 * 2;
        uVar107 = (uint8_t)uVar6;
        uVar109 = uVar65;
        uVar110 = uVar67;
        uVar112 = uVar69;
        uVar113 = uVar71;
        uVar114 = uVar73;
        uVar115 = uVar75;
        uVar116 = uVar77;
        s[0] = alVar24;
        s[1] = alVar25;
        s[2] = alVar26;
        s[3] = alVar27;
        s[5] = alVar97;
      } while (lVar39 < h);
      lVar34 = lVar34 + 8;
      pCVar40 = pCVar40 + 8;
    } while (lVar34 < w);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i wt0 = _mm_set1_epi16(conv_params->fwd_offset);
  const __m128i wt1 = _mm_set1_epi16(conv_params->bck_offset);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

  if (w == 4) {
    __m128i s[8], src6, res, res_shift;
    s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                             xx_loadl_32(src_ptr + 1 * src_stride));
    s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                             xx_loadl_32(src_ptr + 2 * src_stride));
    s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                             xx_loadl_32(src_ptr + 3 * src_stride));
    s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                             xx_loadl_32(src_ptr + 4 * src_stride));
    s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                             xx_loadl_32(src_ptr + 5 * src_stride));
    src6 = xx_loadl_32(src_ptr + 6 * src_stride);
    s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

    do {
      s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
      src6 = xx_loadl_32(src_ptr + 8 * src_stride);
      s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

      res = convolve_lo_y(s + 0, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      __m128i res_16b = _mm_packs_epi32(res_shift, res_shift);
      __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      res = convolve_lo_y(s + 1, coeffs);
      res_shift = _mm_sll_epi32(res, left_shift);
      res_shift =
          _mm_sra_epi32(_mm_add_epi32(res_shift, round_const), round_shift);

      res_16b = _mm_packs_epi32(res_shift, res_shift);
      res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);

      } else {
        _mm_store_si128((__m128i *)dst, res_unsigned);
      }

      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
      s[3] = s[5];
      s[4] = s[6];
      s[5] = s[7];
      h -= 2;
    } while (h);
  } else {
    assert(!(w % 8));
    int j = 0;
    do {
      __m128i s[8], src6, res_lo, res_hi, res_lo_shift, res_hi_shift;
      const uint8_t *data = &src_ptr[j];

      src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
      s[0] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
      s[1] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
      s[2] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
      s[3] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
      s[4] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
      s[5] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

      int i = 0;
      do {
        data = &src_ptr[i * src_stride + j];
        s[6] = _mm_unpacklo_epi8(
            src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
        src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
        s[7] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

        res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);

        __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
        res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels
        res_lo_shift = _mm_sll_epi32(res_lo, left_shift);
        res_hi_shift = _mm_sll_epi32(res_hi, left_shift);
        res_lo_shift = _mm_sra_epi32(_mm_add_epi32(res_lo_shift, round_const),
                                     round_shift);
        res_hi_shift = _mm_sra_epi32(_mm_add_epi32(res_hi_shift, round_const),
                                     round_shift);
        res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        i++;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
      } while (i < h);
      j += 8;
    } while (j < w);
  }
}